

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O0

size_t xemmai::t_type_of<xemmai::t_tuple>::f_do_greater_equal(t_object *a_this,t_pvalue *a_stack)

{
  int iVar1;
  t_object *ptVar2;
  t_tuple *this;
  t_tuple *a_other;
  t_value<xemmai::t_pointer> local_28;
  t_pvalue *local_18;
  t_pvalue *a_stack_local;
  t_object *a_this_local;
  
  local_18 = a_stack;
  a_stack_local = (t_pvalue *)a_this;
  ptVar2 = t_pointer::operator_cast_to_t_object_(&a_stack[2].super_t_pointer);
  f_check<xemmai::t_tuple>(ptVar2,L"argument0");
  this = t_object::f_as<xemmai::t_tuple>((t_object *)a_stack_local);
  ptVar2 = t_pointer::operator->(&local_18[2].super_t_pointer);
  a_other = t_object::f_as<xemmai::t_tuple>(ptVar2);
  iVar1 = t_tuple::f_compare(this,a_other);
  t_value<xemmai::t_pointer>::t_value(&local_28,-1 < iVar1);
  t_value<xemmai::t_pointer>::operator=(local_18,&local_28);
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_tuple>::f_do_greater_equal(t_object* a_this, t_pvalue* a_stack)
{
	f_check<t_tuple>(a_stack[2], L"argument0");
	a_stack[0] = a_this->f_as<t_tuple>().f_compare(a_stack[2]->f_as<t_tuple>()) >= 0;
	return -1;
}